

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  uint uVar1;
  Type TVar2;
  HeapType HVar3;
  HeapType type_local;
  
  TVar2.id = (uintptr_t)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x158),0x10,8);
  *(undefined4 *)TVar2.id = 0x29;
  *(undefined8 *)(TVar2.id + 8) = 0;
  uVar1 = wasm::HeapType::getBottom();
  HVar3.id._4_4_ = 0;
  HVar3.id._0_4_ = uVar1;
  wasm::Type::Type((Type *)&type_local,HVar3,Nullable);
  wasm::RefNull::finalize(TVar2);
  return (RefNull *)TVar2.id;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }